

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

size_t WitnessSigOps(int witversion,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *witprogram,
                    CScriptWitness *witness)

{
  pointer pvVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  CScript subscript;
  direct_or_indirect local_30;
  uint local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (witversion == 0) {
    lVar3 = (long)(witprogram->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(witprogram->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar3 == 0x14) {
      sVar4 = 1;
      goto LAB_001f10f8;
    }
    if ((lVar3 == 0x20) &&
       (pvVar1 = (witness->stack).
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       pvVar1 != (witness->stack).
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_30.indirect_contents,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )pvVar1[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )pvVar1[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      uVar2 = CScript::GetSigOpCount((CScript *)&local_30.indirect_contents,true);
      sVar4 = (size_t)uVar2;
      if (0x1c < local_14) {
        free(local_30.indirect_contents.indirect);
        local_30.indirect_contents.indirect = (char *)0x0;
      }
      goto LAB_001f10f8;
    }
  }
  sVar4 = 0;
LAB_001f10f8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return sVar4;
  }
  __stack_chk_fail();
}

Assistant:

size_t static WitnessSigOps(int witversion, const std::vector<unsigned char>& witprogram, const CScriptWitness& witness)
{
    if (witversion == 0) {
        if (witprogram.size() == WITNESS_V0_KEYHASH_SIZE)
            return 1;

        if (witprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE && witness.stack.size() > 0) {
            CScript subscript(witness.stack.back().begin(), witness.stack.back().end());
            return subscript.GetSigOpCount(true);
        }
    }

    // Future flags may be implemented here.
    return 0;
}